

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRootElements::findPrimary(CollationRootElements *this,uint32_t p)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  long lVar7;
  
  puVar1 = this->elements;
  uVar2 = puVar1[2];
  uVar6 = this->length - 1;
LAB_00232830:
  uVar4 = uVar2;
  if ((int)uVar6 <= (int)(uVar4 + 1)) {
    return uVar4;
  }
  uVar3 = (int)(uVar6 + uVar4) / 2;
  lVar7 = (long)(int)uVar3;
  uVar5 = puVar1[lVar7];
  if ((char)uVar5 < '\0') {
    do {
      if ((long)(int)uVar6 + -1 == lVar7) {
        if (-1 < (char)uVar5) goto LAB_00232883;
        lVar7 = (long)(int)uVar3;
        goto LAB_0023286f;
      }
      uVar5 = puVar1[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while ((char)uVar5 < '\0');
    goto LAB_00232880;
  }
  goto LAB_00232883;
  while( true ) {
    uVar5 = puVar1[lVar7 + -1];
    lVar7 = lVar7 + -1;
    if (-1 < (char)uVar5) break;
LAB_0023286f:
    if ((long)(int)uVar4 + 1 == lVar7) {
      if ((char)uVar5 < '\0') {
        return uVar4;
      }
      goto LAB_00232883;
    }
  }
LAB_00232880:
  uVar3 = (uint32_t)lVar7;
LAB_00232883:
  uVar2 = uVar3;
  if (p < (uVar5 & 0xffffff00)) {
    uVar2 = uVar4;
    uVar6 = uVar3;
  }
  goto LAB_00232830;
}

Assistant:

int32_t
CollationRootElements::findPrimary(uint32_t p) const {
    // Requirement: p must occur as a root primary.
    U_ASSERT((p & 0xff) == 0);  // at most a 3-byte primary
    int32_t index = findP(p);
    // If p is in a range, then we just assume that p is an actual primary in this range.
    // (Too cumbersome/expensive to check.)
    // Otherwise, it must be an exact match.
    U_ASSERT(isEndOfPrimaryRange(elements[index + 1]) || p == (elements[index] & 0xffffff00));
    return index;
}